

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::TextureAttachmentTest::SubTestStatus
          (TextureAttachmentTest *this,GLenum attachment,GLenum texture_target,GLuint level,
          GLuint levels)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar3;
  bool bVar4;
  Enum<int,_2UL> EVar5;
  Enum<int,_2UL> local_218;
  GetNameFunc local_208;
  int local_200;
  Enum<int,_2UL> local_1f8;
  GetNameFunc local_1e8;
  int local_1e0;
  Enum<int,_2UL> local_1d8 [2];
  MessageBuilder local_1b8;
  int local_34;
  long lStack_30;
  GLenum status;
  Functions *gl;
  GLuint levels_local;
  GLuint level_local;
  GLenum texture_target_local;
  GLenum attachment_local;
  TextureAttachmentTest *this_local;
  
  gl._0_4_ = levels;
  gl._4_4_ = level;
  levels_local = texture_target;
  level_local = attachment;
  _texture_target_local = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_30 = CONCAT44(extraout_var,iVar1);
  local_34 = (**(code **)(lStack_30 + 0x170))(0x8d40);
  bVar4 = local_34 == 0x8cd5;
  if (!bVar4) {
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1b8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_1b8,
                        (char (*) [73])
                        "Named Framebuffer Texture Attachment test failed because of framebuffer ");
    EVar5 = glu::getFramebufferStatusStr(local_34);
    local_1e8 = EVar5.m_getName;
    local_1e0 = EVar5.m_value;
    local_1d8[0].m_getName = local_1e8;
    local_1d8[0].m_value = local_1e0;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1d8);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [14])" status with ");
    EVar5 = glu::getTextureTargetStr(levels_local);
    local_208 = EVar5.m_getName;
    local_200 = EVar5.m_value;
    local_1f8.m_getName = local_208;
    local_1f8.m_value = local_200;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1f8);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [20])0x2a6a75e);
    EVar5 = glu::getFramebufferAttachmentStr(level_local);
    local_218.m_getName = EVar5.m_getName;
    local_218.m_value = EVar5.m_value;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_218);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [31])" attachment and texture level ")
    ;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(uint *)((long)&gl + 4));
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [18])" of texture with ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(uint *)&gl);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [9])" levels.");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
  }
  return bVar4;
}

Assistant:

bool TextureAttachmentTest::SubTestStatus(glw::GLenum attachment, glw::GLenum texture_target, glw::GLuint level,
										  glw::GLuint levels)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLenum status = gl.checkFramebufferStatus(GL_FRAMEBUFFER);

	if (GL_FRAMEBUFFER_COMPLETE != status)
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Named Framebuffer Texture Attachment test failed because of framebuffer "
			<< glu::getFramebufferStatusStr(status) << " status with " << glu::getTextureTargetStr(texture_target)
			<< " texture set up as " << glu::getFramebufferAttachmentStr(attachment) << " attachment and texture level "
			<< level << " of texture with " << levels << " levels." << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}